

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRasterizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_1::BaseRenderingCase::BaseRenderingCase
          (BaseRenderingCase *this,Context *context,char *name,char *desc,RenderTarget target,
          int numSamples,int renderSize)

{
  int iVar1;
  int iVar2;
  int iVar3;
  RenderTarget *pRVar4;
  IVec4 bitDepth;
  TextureFormat local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  tcu::TestCase::TestCase((TestCase *)this,context->m_testCtx,name,desc);
  (this->super_TestCase).m_context = context;
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__BaseRenderingCase_02180340;
  this->m_renderSize = renderSize;
  this->m_numSamples = -1;
  this->m_subpixelBits = -1;
  this->m_flatshade = false;
  this->m_numRequestedSamples = numSamples;
  this->m_renderTarget = target;
  this->m_fboInternalFormat = 0x8058;
  if (target == RENDERTARGET_DEFAULT) {
    pRVar4 = Context::getRenderTarget(context);
    iVar1 = (pRVar4->m_pixelFormat).greenBits;
    iVar2 = (pRVar4->m_pixelFormat).blueBits;
    iVar3 = (pRVar4->m_pixelFormat).alphaBits;
    (this->m_pixelFormat).redBits = (pRVar4->m_pixelFormat).redBits;
    (this->m_pixelFormat).greenBits = iVar1;
    (this->m_pixelFormat).blueBits = iVar2;
    (this->m_pixelFormat).alphaBits = iVar3;
  }
  else {
    local_40 = glu::mapGLInternalFormat(0x8058);
    tcu::getTextureFormatBitDepth((tcu *)&local_38,&local_40);
    (this->m_pixelFormat).redBits = (undefined4)local_38;
    (this->m_pixelFormat).greenBits = local_38._4_4_;
    (this->m_pixelFormat).blueBits = (undefined4)uStack_30;
    (this->m_pixelFormat).alphaBits = uStack_30._4_4_;
  }
  this->m_texture = 0;
  this->m_rbo = 0;
  this->m_blitDstFbo = 0;
  this->m_blitDstRbo = 0;
  this->m_shader = (ShaderProgram *)0x0;
  this->m_fbo = 0;
  this->m_texture = 0;
  return;
}

Assistant:

BaseRenderingCase::BaseRenderingCase (Context& context, const char* name, const char* desc, RenderTarget target, int numSamples, int renderSize)
	: TestCase				(context, name, desc)
	, m_renderSize			(renderSize)
	, m_numSamples			(-1)
	, m_subpixelBits		(-1)
	, m_flatshade			(false)
	, m_numRequestedSamples	(numSamples)
	, m_renderTarget		(target)
	, m_fboInternalFormat	(GL_RGBA8)
	, m_pixelFormat			((m_renderTarget == RENDERTARGET_DEFAULT) ? (m_context.getRenderTarget().getPixelFormat()) : (getInternalFormatPixelFormat(m_fboInternalFormat)))
	, m_shader				(DE_NULL)
	, m_fbo					(0)
	, m_texture				(0)
	, m_rbo					(0)
	, m_blitDstFbo			(0)
	, m_blitDstRbo			(0)
{
	DE_ASSERT(m_renderTarget < RENDERTARGET_LAST);
	DE_ASSERT((m_numRequestedSamples == -1) == (m_renderTarget != RENDERTARGET_RBO_MULTISAMPLE));
}